

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void luaC_checkfinalizer(lua_State *L,GCObject *o,Table *mt)

{
  global_State *g_00;
  GCObject **ppGVar1;
  TValue *local_38;
  GCObject *local_30;
  GCObject **p;
  global_State *g;
  Table *mt_local;
  GCObject *o_local;
  lua_State *L_local;
  
  g_00 = L->l_G;
  if ((o->marked & 0x40) == 0) {
    if ((mt == (Table *)0x0) || ((mt->flags & 4) != 0)) {
      local_38 = (TValue *)0x0;
    }
    else {
      local_38 = luaT_gettm(mt,TM_GC,g_00->tmname[2]);
    }
    if ((local_38 != (TValue *)0x0) && ((g_00->gcstp & 4) == 0)) {
      if ((g_00->gcstate < 3) || (6 < g_00->gcstate)) {
        correctpointers(g_00,o);
      }
      else {
        o->marked = o->marked & 199 | g_00->currentwhite & 0x18;
        if ((GCObject *)g_00->sweepgc == o) {
          ppGVar1 = sweeptolive(L,g_00->sweepgc);
          g_00->sweepgc = ppGVar1;
        }
      }
      for (local_30 = (GCObject *)&g_00->allgc; local_30->next != o; local_30 = local_30->next) {
      }
      local_30->next = o->next;
      o->next = g_00->finobj;
      g_00->finobj = o;
      o->marked = o->marked | 0x40;
    }
  }
  return;
}

Assistant:

void luaC_checkfinalizer (lua_State *L, GCObject *o, Table *mt) {
  global_State *g = G(L);
  if (tofinalize(o) ||                 /* obj. is already marked... */
      gfasttm(g, mt, TM_GC) == NULL ||    /* or has no finalizer... */
      (g->gcstp & GCSTPCLS))                   /* or closing state? */
    return;  /* nothing to be done */
  else {  /* move 'o' to 'finobj' list */
    GCObject **p;
    if (issweepphase(g)) {
      makewhite(g, o);  /* "sweep" object 'o' */
      if (g->sweepgc == &o->next)  /* should not remove 'sweepgc' object */
        g->sweepgc = sweeptolive(L, g->sweepgc);  /* change 'sweepgc' */
    }
    else
      correctpointers(g, o);
    /* search for pointer pointing to 'o' */
    for (p = &g->allgc; *p != o; p = &(*p)->next) { /* empty */ }
    *p = o->next;  /* remove 'o' from 'allgc' list */
    o->next = g->finobj;  /* link it in 'finobj' list */
    g->finobj = o;
    l_setbit(o->marked, FINALIZEDBIT);  /* mark it as such */
  }
}